

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.cpp
# Opt level: O0

void __thiscall f8n::runtime::MessageQueue::Dispatch(MessageQueue *this,IMessagePtr *message)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  element_type *peVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  iterator __first;
  iterator __last;
  iterator __i;
  reference pwVar5;
  element_type *peVar6;
  __weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2> *this_00;
  insert_iterator<std::set<std::weak_ptr<f8n::runtime::IMessageTarget>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>_>
  __result;
  _Self local_100;
  _Self local_f8;
  iterator it;
  LockT lock_1;
  shared_ptr<f8n::runtime::IMessageTarget> shared;
  weak_ptr<f8n::runtime::IMessageTarget> receiver;
  iterator __end2;
  iterator __begin2;
  set<std::weak_ptr<f8n::runtime::IMessageTarget>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
  *__range2;
  bool prune;
  undefined1 local_58 [8];
  LockT lock;
  set<std::weak_ptr<f8n::runtime::IMessageTarget>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
  copy;
  IMessagePtr *message_local;
  MessageQueue *this_local;
  
  peVar4 = std::
           __shared_ptr_access<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)message);
  iVar3 = (*peVar4->_vptr_IMessage[2])();
  if (CONCAT44(extraout_var,iVar3) == 0) {
    std::
    set<std::weak_ptr<f8n::runtime::IMessageTarget>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
    ::set((set<std::weak_ptr<f8n::runtime::IMessageTarget>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
           *)&lock._M_owns);
    std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_58,&this->queueMutex)
    ;
    __first = std::
              set<std::weak_ptr<f8n::runtime::IMessageTarget>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
              ::begin(&this->receivers);
    __last = std::
             set<std::weak_ptr<f8n::runtime::IMessageTarget>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
             ::end(&this->receivers);
    __i = std::
          set<std::weak_ptr<f8n::runtime::IMessageTarget>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
          ::begin((set<std::weak_ptr<f8n::runtime::IMessageTarget>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
                   *)&lock._M_owns);
    __result = std::
               inserter<std::set<std::weak_ptr<f8n::runtime::IMessageTarget>,f8n::runtime::MessageQueue::WeakPtrLess,std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>>>>
                         ((set<std::weak_ptr<f8n::runtime::IMessageTarget>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
                           *)&lock._M_owns,__i);
    std::
    copy<std::_Rb_tree_const_iterator<std::weak_ptr<f8n::runtime::IMessageTarget>>,std::insert_iterator<std::set<std::weak_ptr<f8n::runtime::IMessageTarget>,f8n::runtime::MessageQueue::WeakPtrLess,std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>>>>>
              ((_Rb_tree_const_iterator<std::weak_ptr<f8n::runtime::IMessageTarget>_>)
               __first._M_node,
               (_Rb_tree_const_iterator<std::weak_ptr<f8n::runtime::IMessageTarget>_>)__last._M_node
               ,__result);
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_58);
    bVar2 = false;
    __end2 = std::
             set<std::weak_ptr<f8n::runtime::IMessageTarget>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
             ::begin((set<std::weak_ptr<f8n::runtime::IMessageTarget>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
                      *)&lock._M_owns);
    receiver.super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            std::
            set<std::weak_ptr<f8n::runtime::IMessageTarget>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
            ::end((set<std::weak_ptr<f8n::runtime::IMessageTarget>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
                   *)&lock._M_owns);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&receiver.
                                                  super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount), bVar1) {
      pwVar5 = std::_Rb_tree_const_iterator<std::weak_ptr<f8n::runtime::IMessageTarget>_>::operator*
                         (&__end2);
      std::weak_ptr<f8n::runtime::IMessageTarget>::weak_ptr
                ((weak_ptr<f8n::runtime::IMessageTarget> *)
                 &shared.
                  super___shared_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,pwVar5);
      std::weak_ptr<f8n::runtime::IMessageTarget>::lock
                ((weak_ptr<f8n::runtime::IMessageTarget> *)&lock_1._M_owns);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&lock_1._M_owns);
      if (bVar1) {
        peVar6 = std::
                 __shared_ptr_access<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&lock_1._M_owns);
        peVar4 = std::
                 __shared_ptr_access<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*((__shared_ptr_access<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)message);
        (**(code **)(*(long *)peVar6 + 0x10))(peVar6,peVar4);
      }
      else {
        bVar2 = true;
      }
      std::shared_ptr<f8n::runtime::IMessageTarget>::~shared_ptr
                ((shared_ptr<f8n::runtime::IMessageTarget> *)&lock_1._M_owns);
      std::weak_ptr<f8n::runtime::IMessageTarget>::~weak_ptr
                ((weak_ptr<f8n::runtime::IMessageTarget> *)
                 &shared.
                  super___shared_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::_Rb_tree_const_iterator<std::weak_ptr<f8n::runtime::IMessageTarget>_>::operator++
                (&__end2);
    }
    if (bVar2) {
      std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&it,&this->queueMutex);
      local_f8._M_node =
           (_Base_ptr)
           std::
           set<std::weak_ptr<f8n::runtime::IMessageTarget>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
           ::begin(&this->receivers);
      while( true ) {
        local_100._M_node =
             (_Base_ptr)
             std::
             set<std::weak_ptr<f8n::runtime::IMessageTarget>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
             ::end(&this->receivers);
        bVar2 = std::operator!=(&local_f8,&local_100);
        if (!bVar2) break;
        this_00 = &std::_Rb_tree_const_iterator<std::weak_ptr<f8n::runtime::IMessageTarget>_>::
                   operator->(&local_f8)->
                   super___weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>;
        bVar2 = std::__weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>::expired
                          (this_00);
        if (bVar2) {
          local_f8._M_node =
               (_Base_ptr)
               std::
               set<std::weak_ptr<f8n::runtime::IMessageTarget>,f8n::runtime::MessageQueue::WeakPtrLess,std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>>>
               ::erase_abi_cxx11_((set<std::weak_ptr<f8n::runtime::IMessageTarget>,f8n::runtime::MessageQueue::WeakPtrLess,std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>>>
                                   *)&this->receivers,local_f8._M_node);
        }
        else {
          std::_Rb_tree_const_iterator<std::weak_ptr<f8n::runtime::IMessageTarget>_>::operator++
                    (&local_f8);
        }
      }
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&it);
    }
    std::
    set<std::weak_ptr<f8n::runtime::IMessageTarget>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
    ::~set((set<std::weak_ptr<f8n::runtime::IMessageTarget>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
            *)&lock._M_owns);
  }
  else {
    peVar4 = std::
             __shared_ptr_access<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)message);
    iVar3 = (*peVar4->_vptr_IMessage[2])();
    peVar4 = std::
             __shared_ptr_access<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)message);
    (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x10))
              ((long *)CONCAT44(extraout_var_00,iVar3),peVar4);
  }
  return;
}

Assistant:

void MessageQueue::Dispatch(IMessagePtr message) {
    if (message->Target()) {
        message->Target()->ProcessMessage(*message);
    }
    else {
        std::set<IWeakMessageTarget, WeakPtrLess> copy;

        /* copy to dispatch outside of a lock */
        {
            LockT lock(this->queueMutex);
            std::copy(
                receivers.begin(),
                receivers.end(),
                std::inserter(copy, copy.begin()));
        }

        /* dispatch */
        bool prune = false;
        for (auto receiver : copy) {
            auto shared = receiver.lock();
            if (shared) {
                shared->ProcessMessage(*message);
            }
            else {
                prune = true;
            }
        }

        if (prune) { /* at least one of our weak_ptrs is dead. */
            LockT lock(this->queueMutex);
            auto it = this->receivers.begin();
            while (it != this->receivers.end()) {
                if (it->expired()) {
                    it = this->receivers.erase(it);
                }
                else {
                    ++it;
                }
            }
        }
    }
}